

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_zero_Test::~unitStrings_zero_Test(unitStrings_zero_Test *this)

{
  unitStrings_zero_Test *this_local;
  
  ~unitStrings_zero_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStrings, zero)
{
    auto zunit = precise_unit(0.0, precise::one);
    auto res = to_string(zunit);
    EXPECT_EQ(res, "0");
    auto zresult = unit_from_string(res);
    EXPECT_EQ(zresult, zunit);

    EXPECT_EQ(to_string(zunit * precise::m / precise::s), "0*m/s");
}